

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimplePropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimplePropertyExprSyntax,slang::syntax::SequenceExprSyntax&>
          (BumpAllocator *this,SequenceExprSyntax *args)

{
  SimplePropertyExprSyntax *pSVar1;
  SequenceExprSyntax *in_RDI;
  SimplePropertyExprSyntax *unaff_retaddr;
  
  pSVar1 = (SimplePropertyExprSyntax *)
           allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  slang::syntax::SimplePropertyExprSyntax::SimplePropertyExprSyntax(unaff_retaddr,in_RDI);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }